

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-demo.cpp
# Opt level: O1

void MyDocument::DisplayContextMenu(MyDocument *doc)

{
  bool bVar1;
  char buf [256];
  char acStack_118 [264];
  
  bVar1 = ImGui::BeginPopupContextItem((char *)0x0,1);
  if (bVar1) {
    sprintf(acStack_118,"Save %s",doc->Name);
    bVar1 = ImGui::MenuItem(acStack_118,"CTRL+S",false,doc->Open);
    if (bVar1) {
      doc->Dirty = false;
    }
    bVar1 = ImGui::MenuItem("Close","CTRL+W",false,doc->Open);
    if (bVar1) {
      doc->WantClose = true;
    }
    ImGui::EndPopup();
  }
  return;
}

Assistant:

static void DisplayContextMenu(MyDocument* doc)
    {
        if (!ImGui::BeginPopupContextItem())
            return;

        char buf[256];
        sprintf(buf, "Save %s", doc->Name);
        if (ImGui::MenuItem(buf, "CTRL+S", false, doc->Open))
            doc->DoSave();
        if (ImGui::MenuItem("Close", "CTRL+W", false, doc->Open))
            doc->DoQueueClose();
        ImGui::EndPopup();
    }